

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Vector2f __thiscall Rml::Element::GetAbsoluteOffset(Element *this,BoxArea area)

{
  Vector2f VVar1;
  Vector2f VVar2;
  
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  if (area == Border) {
    VVar2 = this->absolute_offset;
  }
  else {
    VVar1 = Box::GetPosition(&this->main_box,area);
    VVar2.x = (this->absolute_offset).x + VVar1.x;
    VVar2.y = (this->absolute_offset).y + VVar1.y;
  }
  return VVar2;
}

Assistant:

Vector2f Element::GetAbsoluteOffset(BoxArea area)
{
	UpdateAbsoluteOffsetAndRenderBoxData();
	return area == BoxArea::Border ? absolute_offset : absolute_offset + GetBox().GetPosition(area);
}